

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderprogram.cpp
# Opt level: O1

void __thiscall graphics101::ShaderProgram::~ShaderProgram(ShaderProgram *this)

{
  (*gl3wProcs.ptr[0x22f])(0);
  (*gl3wProcs.ptr[0x6c])((ulong)this->m_program);
  this->m_program = 0;
  return;
}

Assistant:

ShaderProgram::~ShaderProgram()
{
    // glUseProgram(0) so that we can delete the program right away.
    glUseProgram(0);
    
    // Note: It is not an error to delete 0.
    glDeleteProgram( m_program );
    
    // The call to glDeleteProgram() doesn't actually
    // change the value stored in m_program.
    // Let's set it to 0, which is an invalid value,
    // for the sake of people debugging.
    m_program = 0;
}